

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O2

boolean compress_output(j_compress_ptr cinfo,JSAMPIMAGE input_buf)

{
  JDIMENSION JVar1;
  uint uVar2;
  jpeg_c_coef_controller *pjVar3;
  boolean bVar4;
  JBLOCKARRAY ppaJVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  JBLOCKROW paJVar16;
  JBLOCKARRAY buffer [4];
  
  pjVar3 = cinfo->coef;
  for (lVar15 = 0; lVar15 < cinfo->comps_in_scan; lVar15 = lVar15 + 1) {
    JVar1 = cinfo->cur_comp_info[lVar15]->v_samp_factor;
    ppaJVar5 = (*cinfo->mem->access_virt_barray)
                         ((j_common_ptr)cinfo,
                          (jvirt_barray_ptr)
                          (&pjVar3[7].start_pass)[cinfo->cur_comp_info[lVar15]->component_index],
                          *(int *)&pjVar3[1].start_pass * JVar1,JVar1,0);
    buffer[lVar15] = ppaJVar5;
  }
  lVar15 = (long)*(int *)&pjVar3[1].compress_data;
  do {
    if (*(int *)((long)&pjVar3[1].compress_data + 4) <= lVar15) {
      *(int *)&pjVar3[1].start_pass = *(int *)&pjVar3[1].start_pass + 1;
      start_iMCU_row(cinfo);
      return 1;
    }
    for (uVar9 = *(uint *)((long)&pjVar3[1].start_pass + 4); uVar9 < cinfo->MCUs_per_row;
        uVar9 = uVar9 + 1) {
      uVar7 = 0;
      uVar6 = (ulong)(uint)cinfo->comps_in_scan;
      if (cinfo->comps_in_scan < 1) {
        uVar6 = uVar7;
      }
      iVar12 = 0;
      for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
        iVar10 = cinfo->cur_comp_info[uVar7]->MCU_width;
        uVar11 = iVar10 * uVar9;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        uVar2 = cinfo->cur_comp_info[uVar7]->MCU_height;
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        iVar8 = iVar12;
        for (uVar13 = 0; iVar12 = iVar12 + iVar10, uVar13 != uVar2; uVar13 = uVar13 + 1) {
          paJVar16 = buffer[uVar7][uVar13 + lVar15] + uVar11;
          for (lVar14 = (long)iVar8; iVar12 != lVar14; lVar14 = lVar14 + 1) {
            (&pjVar3[2].start_pass)[lVar14] = (_func_void_j_compress_ptr_J_BUF_MODE *)paJVar16;
            paJVar16 = paJVar16 + 1;
          }
          iVar8 = iVar10 + iVar8;
        }
        iVar12 = iVar8;
      }
      bVar4 = (*cinfo->entropy->encode_mcu)(cinfo,(JBLOCKROW *)(pjVar3 + 2));
      if (bVar4 == 0) {
        *(int *)&pjVar3[1].compress_data = (int)lVar15;
        *(uint *)((long)&pjVar3[1].start_pass + 4) = uVar9;
        return 0;
      }
    }
    *(undefined4 *)((long)&pjVar3[1].start_pass + 4) = 0;
    lVar15 = lVar15 + 1;
  } while( true );
}

Assistant:

METHODDEF(boolean)
compress_output (j_compress_ptr cinfo, JSAMPIMAGE input_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION MCU_col_num;	/* index of current MCU within row */
  int blkn, ci, xindex, yindex, yoffset;
  JDIMENSION start_col;
  JBLOCKARRAY buffer[MAX_COMPS_IN_SCAN];
  JBLOCKROW buffer_ptr;
  jpeg_component_info *compptr;

  /* Align the virtual buffers for the components used in this scan.
   * NB: during first pass, this is safe only because the buffers will
   * already be aligned properly, so jmemmgr.c won't need to do any I/O.
   */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    buffer[ci] = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr) cinfo, coef->whole_image[compptr->component_index],
       coef->iMCU_row_num * compptr->v_samp_factor,
       (JDIMENSION) compptr->v_samp_factor, FALSE);
  }

  /* Loop to process one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->mcu_ctr; MCU_col_num < cinfo->MCUs_per_row;
	 MCU_col_num++) {
      /* Construct list of pointers to DCT blocks belonging to this MCU */
      blkn = 0;			/* index of current DCT block within MCU */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
	compptr = cinfo->cur_comp_info[ci];
	start_col = MCU_col_num * compptr->MCU_width;
	for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
	  buffer_ptr = buffer[ci][yindex+yoffset] + start_col;
	  for (xindex = 0; xindex < compptr->MCU_width; xindex++) {
	    coef->MCU_buffer[blkn++] = buffer_ptr++;
	  }
	}
      }
      /* Try to write the MCU. */
      if (! (*cinfo->entropy->encode_mcu) (cinfo, coef->MCU_buffer)) {
	/* Suspension forced; update state counters and exit */
	coef->MCU_vert_offset = yoffset;
	coef->mcu_ctr = MCU_col_num;
	return FALSE;
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->mcu_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  coef->iMCU_row_num++;
  start_iMCU_row(cinfo);
  return TRUE;
}